

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat_meat.hpp
# Opt level: O2

void __thiscall
arma::Mat<double>::Mat<arma::subview_col<double>,arma::subview_col<double>,arma::eglue_schur>
          (Mat<double> *this,
          eGlue<arma::subview_col<double>,_arma::subview_col<double>,_arma::eglue_schur> *X)

{
  subview_col<double> *psVar1;
  
  psVar1 = (X->P1).Q;
  this->n_rows = (psVar1->super_subview<double>).n_rows;
  this->n_cols = 1;
  this->n_elem = (psVar1->super_subview<double>).n_elem;
  this->mem = (double *)0x0;
  this->n_alloc = 0;
  this->vec_state = 0;
  this->mem_state = 0;
  init_cold(this);
  eglue_core<arma::eglue_schur>::
  apply<arma::Mat<double>,arma::subview_col<double>,arma::subview_col<double>>(this,X);
  return;
}

Assistant:

inline
Mat<eT>::Mat(const eGlue<T1, T2, eglue_type>& X)
  : n_rows(X.get_n_rows())
  , n_cols(X.get_n_cols())
  , n_elem(X.get_n_elem())
  , n_alloc()
  , vec_state(0)
  , mem_state(0)
  , mem()
  {
  arma_debug_sigprint_this(this);
  
  arma_type_check(( is_same_type< eT, typename T1::elem_type >::no ));
  arma_type_check(( is_same_type< eT, typename T2::elem_type >::no ));
  
  init_cold();
  
  eglue_type::apply(*this, X);
  }